

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

unsigned_long hash_string(char *string,size_t n)

{
  ulong local_30;
  size_t i;
  unsigned_long uStack_20;
  uchar c;
  unsigned_long hash;
  size_t n_local;
  char *string_local;
  
  uStack_20 = 0x1505;
  for (local_30 = 0; (local_30 < n && (string[local_30] != 0)); local_30 = local_30 + 1) {
    uStack_20 = uStack_20 * 0x21 + (ulong)(byte)string[local_30];
  }
  return uStack_20;
}

Assistant:

static unsigned long hash_string(const char *string, size_t n) {
#ifdef PARSON_FORCE_HASH_COLLISIONS
    (void)string;
    (void)n;
    return 0;
#else
    unsigned long hash = 5381;
    unsigned char c;
    size_t i = 0;
    for (i = 0; i < n; i++) {
        c = string[i];
        if (c == '\0') {
            break;
        }
        hash = ((hash << 5) + hash) + c; /* hash * 33 + c */
    }
    return hash;
#endif
}